

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O1

void * mwUnmark(void *p,char *file,uint line)

{
  mwMarker *pmVar1;
  undefined4 in_register_00000014;
  mwMarker **ppmVar2;
  mwMarker *__ptr;
  
  if (mwFirstMark == (mwMarker *)0x0) {
LAB_00107679:
    mwWrite("mark: %s(%d), no mark found for %p\n",file,CONCAT44(in_register_00000014,line),p);
  }
  else {
    __ptr = mwFirstMark;
    if (mwFirstMark->host == p) {
      pmVar1 = (mwMarker *)0x0;
    }
    else {
      do {
        pmVar1 = __ptr;
        __ptr = pmVar1->next;
        if (__ptr == (mwMarker *)0x0) goto LAB_00107679;
      } while (__ptr->host != p);
    }
    if (__ptr->level < 2) {
      ppmVar2 = &mwFirstMark;
      if (pmVar1 != (mwMarker *)0x0) {
        ppmVar2 = &pmVar1->next;
      }
      *ppmVar2 = __ptr->next;
      free(__ptr->text);
      free(__ptr);
    }
    else {
      __ptr->level = __ptr->level + -1;
    }
  }
  return p;
}

Assistant:

void *mwUnmark(void *p, const char *file, unsigned line)
{
	mwMarker *mrk, *prv;
	mrk = mwFirstMark;
	prv = NULL;
	while (mrk) {
		if (mrk->host == p) {
			if (mrk->level < 2) {
				if (prv) {
					prv->next = mrk->next;
				} else {
					mwFirstMark = mrk->next;
				}
				free(mrk->text);
				free(mrk);
				return p;
			}
			mrk->level --;
			return p;
		}
		prv = mrk;
		mrk = mrk->next;
	}
	mwWrite("mark: %s(%d), no mark found for %p\n", file, line, p);
	return p;
}